

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

int __thiscall FNodeBuilder::MarkLoop(FNodeBuilder *this,DWORD firstseg,int loopnum)

{
  int iVar1;
  sector_t *psVar2;
  FPrivVert *pFVar3;
  uint uVar4;
  FPrivSeg *pFVar5;
  uint uVar6;
  uint uVar7;
  DWORD DVar8;
  double dVar9;
  double dVar10;
  
  pFVar5 = (this->Segs).Array;
  if (pFVar5[firstseg].loopnum == 0) {
    psVar2 = pFVar5[firstseg].frontsector;
    while( true ) {
      pFVar5[firstseg].loopnum = loopnum;
      iVar1 = pFVar5[firstseg].v2;
      pFVar3 = (this->Vertices).Array;
      DVar8 = pFVar3[iVar1].segs;
      dVar9 = c_atan2((double)(pFVar3[iVar1].super_FSimpleVert.y -
                              pFVar3[pFVar5[firstseg].v1].super_FSimpleVert.y),
                      (double)(pFVar3[iVar1].super_FSimpleVert.x -
                              pFVar3[pFVar5[firstseg].v1].super_FSimpleVert.x));
      if (DVar8 == 0xffffffff) break;
      uVar7 = 0xffffffff;
      firstseg = 0xffffffff;
      uVar6 = 0xffffffff;
      do {
        pFVar5 = (this->Segs).Array + DVar8;
        if (pFVar5->frontsector == psVar2) {
          pFVar3 = (this->Vertices).Array;
          dVar10 = c_atan2((double)(pFVar3[pFVar5->v1].super_FSimpleVert.y -
                                   pFVar3[pFVar5->v2].super_FSimpleVert.y),
                           (double)(pFVar3[pFVar5->v1].super_FSimpleVert.x -
                                   pFVar3[pFVar5->v2].super_FSimpleVert.x));
          uVar4 = ((int)(dVar10 * 341782637.7882158) - (int)(dVar9 * 341782637.7882158)) * 2;
          firstseg = uVar7;
          if (uVar4 < uVar6 && uVar4 != 0) {
            firstseg = DVar8;
            uVar6 = uVar4;
            uVar7 = DVar8;
          }
        }
        DVar8 = pFVar5->nextforvert;
      } while (DVar8 != 0xffffffff);
      if ((firstseg == 0xffffffff) || (pFVar5 = (this->Segs).Array, pFVar5[firstseg].loopnum != 0))
      break;
    }
    loopnum = loopnum + 1;
  }
  return loopnum;
}

Assistant:

int FNodeBuilder::MarkLoop (DWORD firstseg, int loopnum)
{
	DWORD seg;
	sector_t *sec = Segs[firstseg].frontsector;

	if (Segs[firstseg].loopnum != 0)
	{ // already marked
		return loopnum;
	}

	seg = firstseg;

	do
	{
		FPrivSeg *s1 = &Segs[seg];

		s1->loopnum = loopnum;

		P(Printf ("Mark seg %d (%d,%d)-(%d,%d)\n", seg,
				Vertices[s1->v1].x>>16, Vertices[s1->v1].y>>16,
				Vertices[s1->v2].x>>16, Vertices[s1->v2].y>>16));

		DWORD bestseg = DWORD_MAX;
		DWORD tryseg = Vertices[s1->v2].segs;
		angle_t bestang = ANGLE_MAX;
		angle_t ang1 = PointToAngle (Vertices[s1->v2].x - Vertices[s1->v1].x,
			Vertices[s1->v2].y - Vertices[s1->v1].y);

		while (tryseg != DWORD_MAX)
		{
			FPrivSeg *s2 = &Segs[tryseg];

			if (s2->frontsector == sec)
			{
				angle_t ang2 = PointToAngle (Vertices[s2->v1].x - Vertices[s2->v2].x,
					Vertices[s2->v1].y - Vertices[s2->v2].y);
				angle_t angdiff = ang2 - ang1;

				if (angdiff < bestang && angdiff > 0)
				{
					bestang = angdiff;
					bestseg = tryseg;
				}
			}
			tryseg = s2->nextforvert;
		}

		seg = bestseg;
	} while (seg != DWORD_MAX && Segs[seg].loopnum == 0);

	return loopnum + 1;
}